

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despacer.c
# Opt level: O1

size_t avx2_despace_branchless(char *bytes,size_t howmany)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  byte bVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  size_t sVar10;
  ulong uVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  
  if (howmany < 0x20) {
    uVar11 = 0;
    sVar10 = 0;
  }
  else {
    sVar10 = 0;
    auVar14[8] = 0x20;
    auVar14._0_8_ = 0x2020202020202020;
    auVar14[9] = 0x20;
    auVar14[10] = 0x20;
    auVar14[0xb] = 0x20;
    auVar14[0xc] = 0x20;
    auVar14[0xd] = 0x20;
    auVar14[0xe] = 0x20;
    auVar14[0xf] = 0x20;
    auVar14[0x10] = 0x20;
    auVar14[0x11] = 0x20;
    auVar14[0x12] = 0x20;
    auVar14[0x13] = 0x20;
    auVar14[0x14] = 0x20;
    auVar14[0x15] = 0x20;
    auVar14[0x16] = 0x20;
    auVar14[0x17] = 0x20;
    auVar14[0x18] = 0x20;
    auVar14[0x19] = 0x20;
    auVar14[0x1a] = 0x20;
    auVar14[0x1b] = 0x20;
    auVar14[0x1c] = 0x20;
    auVar14[0x1d] = 0x20;
    auVar14[0x1e] = 0x20;
    auVar14[0x1f] = 0x20;
    auVar16[8] = 10;
    auVar16._0_8_ = 0xa0a0a0a0a0a0a0a;
    auVar16[9] = 10;
    auVar16[10] = 10;
    auVar16[0xb] = 10;
    auVar16[0xc] = 10;
    auVar16[0xd] = 10;
    auVar16[0xe] = 10;
    auVar16[0xf] = 10;
    auVar16[0x10] = 10;
    auVar16[0x11] = 10;
    auVar16[0x12] = 10;
    auVar16[0x13] = 10;
    auVar16[0x14] = 10;
    auVar16[0x15] = 10;
    auVar16[0x16] = 10;
    auVar16[0x17] = 10;
    auVar16[0x18] = 10;
    auVar16[0x19] = 10;
    auVar16[0x1a] = 10;
    auVar16[0x1b] = 10;
    auVar16[0x1c] = 10;
    auVar16[0x1d] = 10;
    auVar16[0x1e] = 10;
    auVar16[0x1f] = 10;
    auVar18[8] = 0xd;
    auVar18._0_8_ = 0xd0d0d0d0d0d0d0d;
    auVar18[9] = 0xd;
    auVar18[10] = 0xd;
    auVar18[0xb] = 0xd;
    auVar18[0xc] = 0xd;
    auVar18[0xd] = 0xd;
    auVar18[0xe] = 0xd;
    auVar18[0xf] = 0xd;
    auVar18[0x10] = 0xd;
    auVar18[0x11] = 0xd;
    auVar18[0x12] = 0xd;
    auVar18[0x13] = 0xd;
    auVar18[0x14] = 0xd;
    auVar18[0x15] = 0xd;
    auVar18[0x16] = 0xd;
    auVar18[0x17] = 0xd;
    auVar18[0x18] = 0xd;
    auVar18[0x19] = 0xd;
    auVar18[0x1a] = 0xd;
    auVar18[0x1b] = 0xd;
    auVar18[0x1c] = 0xd;
    auVar18[0x1d] = 0xd;
    auVar18[0x1e] = 0xd;
    auVar18[0x1f] = 0xd;
    uVar8 = 0;
    do {
      uVar11 = uVar8 + 0x20;
      auVar2 = *(undefined1 (*) [32])(bytes + uVar8);
      uVar4 = vpcmpeqb_avx512vl(auVar2,auVar14);
      uVar5 = vpcmpeqb_avx512vl(auVar2,auVar16);
      uVar6 = vpcmpeqb_avx512vl(auVar2,auVar18);
      uVar7 = (uint)uVar5 | (uint)uVar4 | (uint)uVar6;
      auVar19._0_16_ =
           ZEXT116(0) * *(undefined1 (*) [16])("" + (uVar7 >> 0xc & 0x7fff0)) +
           ZEXT116(1) * *(undefined1 (*) [16])("" + ((uVar7 & 0x7fff) << 4));
      auVar19._16_16_ =
           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
           ZEXT116(1) * *(undefined1 (*) [16])("" + (uVar7 >> 0xc & 0x7fff0));
      auVar2 = vpshufb_avx2(auVar2,auVar19);
      lVar9 = 0x10 - (ulong)(uint)POPCOUNT(uVar7 & 0xffff);
      *(undefined1 (*) [16])(bytes + sVar10) = auVar2._0_16_;
      *(undefined1 (*) [16])(bytes + lVar9 + sVar10) = auVar2._16_16_;
      sVar10 = (((int)lVar9 - POPCOUNT(uVar7 >> 0x10)) + 0x10) + sVar10;
      uVar12 = uVar8 + 0x3f;
      uVar8 = uVar11;
    } while (uVar12 < howmany);
  }
  if ((uVar11 | 0xf) < howmany) {
    auVar13[8] = 0x20;
    auVar13._0_8_ = 0x2020202020202020;
    auVar13[9] = 0x20;
    auVar13[10] = 0x20;
    auVar13[0xb] = 0x20;
    auVar13[0xc] = 0x20;
    auVar13[0xd] = 0x20;
    auVar13[0xe] = 0x20;
    auVar13[0xf] = 0x20;
    auVar15[8] = 10;
    auVar15._0_8_ = 0xa0a0a0a0a0a0a0a;
    auVar15[9] = 10;
    auVar15[10] = 10;
    auVar15[0xb] = 10;
    auVar15[0xc] = 10;
    auVar15[0xd] = 10;
    auVar15[0xe] = 10;
    auVar15[0xf] = 10;
    auVar17[8] = 0xd;
    auVar17._0_8_ = 0xd0d0d0d0d0d0d0d;
    auVar17[9] = 0xd;
    auVar17[10] = 0xd;
    auVar17[0xb] = 0xd;
    auVar17[0xc] = 0xd;
    auVar17[0xd] = 0xd;
    auVar17[0xe] = 0xd;
    auVar17[0xf] = 0xd;
    uVar8 = uVar11;
    do {
      uVar11 = uVar8 + 0x10;
      auVar1 = *(undefined1 (*) [16])(bytes + uVar8);
      uVar4 = vpcmpeqb_avx512vl(auVar1,auVar13);
      uVar5 = vpcmpeqb_avx512vl(auVar1,auVar15);
      uVar6 = vpcmpeqb_avx512vl(auVar1,auVar17);
      uVar7 = (uint)(ushort)((ushort)uVar5 | (ushort)uVar4 | (ushort)uVar6);
      auVar1 = vpshufb_avx(auVar1,*(undefined1 (*) [16])("" + ((uVar7 & 0x7fff) << 4)));
      *(undefined1 (*) [16])(bytes + sVar10) = auVar1;
      sVar10 = (0x10 - POPCOUNT(uVar7)) + sVar10;
      uVar12 = uVar8 + 0x1f;
      uVar8 = uVar11;
    } while (uVar12 < howmany);
  }
  if (uVar11 < howmany) {
    do {
      bVar3 = bytes[uVar11];
      if ((0x20 < (ulong)bVar3) || ((0x100002400U >> ((ulong)bVar3 & 0x3f) & 1) == 0)) {
        bytes[sVar10] = bVar3;
        sVar10 = sVar10 + 1;
      }
      uVar11 = uVar11 + 1;
    } while (howmany != uVar11);
  }
  return sVar10;
}

Assistant:

size_t avx2_despace_branchless(char *bytes, size_t howmany) {
  size_t pos = 0;
  __m128i spaces = _mm_set1_epi8(' ');
  __m128i newline = _mm_set1_epi8('\n');
  __m128i carriage = _mm_set1_epi8('\r');

  __m256i spaces256 = _mm256_set1_epi8(' ');
  __m256i newline256 = _mm256_set1_epi8('\n');
  __m256i carriage256 = _mm256_set1_epi8('\r');

  size_t i = 0;
  for (; i + 32 - 1 < howmany; i += 32) {
    __m256i x = _mm256_loadu_si256((const __m256i *)(bytes + i));
    unsigned int masklow, maskhigh;
    x = cleanm256(x, spaces256, newline256, carriage256, &masklow, &maskhigh);
    int offset1 = 16 - _mm_popcnt_u32(masklow);
    int offset2 = 16 - _mm_popcnt_u32(maskhigh);
    _mm256_storeu2_m128i((__m128i *)(bytes + pos + offset1),
                         (__m128i *)(bytes + pos), x);
    pos += offset1 + offset2;
  }
  for (; i + 16 - 1 < howmany; i += 16) {
    __m128i x = _mm_loadu_si128((const __m128i *)(bytes + i));
    int mask16;
    x = cleanm128(x, spaces, newline, carriage, &mask16);
    _mm_storeu_si128((__m128i *)(bytes + pos), x);
    pos += 16 - _mm_popcnt_u32(mask16);
  }
  for (; i < howmany; i++) {
    char c = bytes[i];
    if (c == '\r' || c == '\n' || c == ' ') {
      continue;
    }
    bytes[pos++] = c;
  }
  return pos;
}